

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateAccessorDeclarations
          (MessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  bVar1 = IsFieldStripped((this->super_FieldGenerator).descriptor_,
                          (this->super_FieldGenerator).options_);
  if (bVar1) {
    Formatter::operator()
              ((Formatter *)local_50,
               "$deprecated_attr$const $type$& ${1$$name$$}$() const { __builtin_trap(); }\nPROTOBUF_NODISCARD $deprecated_attr$$type$* ${1$$release_name$$}$() { __builtin_trap(); }\n$deprecated_attr$$type$* ${1$mutable_$name$$}$() { __builtin_trap(); }\n$deprecated_attr$void ${1$set_allocated_$name$$}$($type$* $name$) { __builtin_trap(); }\n$deprecated_attr$void ${1$unsafe_arena_set_allocated_$name$$}$(\n    $type$* $name$) { __builtin_trap(); }\n$deprecated_attr$$type$* ${1$unsafe_arena_release_$name$$}$() { __builtin_trap(); }\n"
               ,&(this->super_FieldGenerator).descriptor_);
  }
  else {
    Formatter::operator()
              ((Formatter *)local_50,
               "$deprecated_attr$const $type$& ${1$$name$$}$() const;\nPROTOBUF_NODISCARD $deprecated_attr$$type$* ${1$$release_name$$}$();\n$deprecated_attr$$type$* ${1$mutable_$name$$}$();\n$deprecated_attr$void ${1$set_allocated_$name$$}$($type$* $name$);\n"
               ,&(this->super_FieldGenerator).descriptor_);
    bVar1 = IsFieldStripped((this->super_FieldGenerator).descriptor_,
                            (this->super_FieldGenerator).options_);
    if (!bVar1) {
      Formatter::operator()
                ((Formatter *)local_50,
                 "private:\nconst $type$& ${1$_internal_$name$$}$() const;\n$type$* ${1$_internal_mutable_$name$$}$();\npublic:\n"
                 ,&(this->super_FieldGenerator).descriptor_);
    }
    Formatter::operator()
              ((Formatter *)local_50,
               "$deprecated_attr$void ${1$unsafe_arena_set_allocated_$name$$}$(\n    $type$* $name$);\n$deprecated_attr$$type$* ${1$unsafe_arena_release_$name$$}$();\n"
               ,&(this->super_FieldGenerator).descriptor_);
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (IsFieldStripped(descriptor_, options_)) {
    format(
        "$deprecated_attr$const $type$& ${1$$name$$}$() const { "
        "__builtin_trap(); }\n"
        "PROTOBUF_NODISCARD $deprecated_attr$$type$* "
        "${1$$release_name$$}$() { "
        "__builtin_trap(); }\n"
        "$deprecated_attr$$type$* ${1$mutable_$name$$}$() { "
        "__builtin_trap(); }\n"
        "$deprecated_attr$void ${1$set_allocated_$name$$}$"
        "($type$* $name$) { __builtin_trap(); }\n"
        "$deprecated_attr$void "
        "${1$unsafe_arena_set_allocated_$name$$}$(\n"
        "    $type$* $name$) { __builtin_trap(); }\n"
        "$deprecated_attr$$type$* ${1$unsafe_arena_release_$name$$}$() { "
        "__builtin_trap(); }\n",
        descriptor_);
    return;
  }
  format(
      "$deprecated_attr$const $type$& ${1$$name$$}$() const;\n"
      "PROTOBUF_NODISCARD $deprecated_attr$$type$* "
      "${1$$release_name$$}$();\n"
      "$deprecated_attr$$type$* ${1$mutable_$name$$}$();\n"
      "$deprecated_attr$void ${1$set_allocated_$name$$}$"
      "($type$* $name$);\n",
      descriptor_);
  if (!IsFieldStripped(descriptor_, options_)) {
    format(
        "private:\n"
        "const $type$& ${1$_internal_$name$$}$() const;\n"
        "$type$* ${1$_internal_mutable_$name$$}$();\n"
        "public:\n",
        descriptor_);
  }
  format(
      "$deprecated_attr$void "
      "${1$unsafe_arena_set_allocated_$name$$}$(\n"
      "    $type$* $name$);\n"
      "$deprecated_attr$$type$* ${1$unsafe_arena_release_$name$$}$();\n",
      descriptor_);
}